

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ProceduralDeassignStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ProceduralDeassignStatement,slang::ast::Expression_const&,bool&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,bool *args_1,SourceRange *args_2)

{
  bool bVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  ProceduralDeassignStatement *pPVar4;
  
  pPVar4 = (ProceduralDeassignStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ProceduralDeassignStatement *)this->endPtr < pPVar4 + 1) {
    pPVar4 = (ProceduralDeassignStatement *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pPVar4 + 1);
  }
  bVar1 = *args_1;
  SVar2 = args_2->startLoc;
  SVar3 = args_2->endLoc;
  (pPVar4->super_Statement).kind = ProceduralDeassign;
  (pPVar4->super_Statement).syntax = (StatementSyntax *)0x0;
  (pPVar4->super_Statement).sourceRange.startLoc = SVar2;
  (pPVar4->super_Statement).sourceRange.endLoc = SVar3;
  pPVar4->lvalue = args;
  pPVar4->isRelease = bVar1;
  return pPVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }